

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int accum_state_mean(vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,uint32 *veclen,
                    uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  float32 **ppfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (n_frame != 0) {
    uVar8 = 0;
    do {
      uVar5 = 0;
      uVar9 = 0;
      if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
        uVar5 = sseq[uVar8];
        uVar9 = ci_sseq[uVar8];
      }
      if (n_feat != 0) {
        ppfVar2 = dnom[uVar5];
        uVar6 = 0;
        do {
          *ppfVar2[uVar6] = (float32)((float)*ppfVar2[uVar6] + 1.0);
          if (uVar5 != uVar9) {
            *dnom[uVar9][uVar6] = (float32)((float)*dnom[uVar9][uVar6] + 1.0);
          }
          uVar1 = veclen[uVar6];
          if ((ulong)uVar1 != 0) {
            pfVar3 = feat[uVar8][uVar6];
            pfVar4 = *mean[uVar5][uVar6];
            uVar7 = 0;
            do {
              pfVar4[uVar7] = pfVar3[uVar7] + pfVar4[uVar7];
              if (uVar5 != uVar9) {
                (*mean[uVar9][uVar6])[uVar7] = pfVar3[uVar7] + (*mean[uVar9][uVar6])[uVar7];
              }
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != n_feat);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != n_frame);
  }
  return 0;
}

Assistant:

int
accum_state_mean(vector_t ***mean,
		 float32 ***dnom,
		 vector_t **feat,
		 uint32 n_feat,
		 const uint32 *veclen,
		 uint32 *sseq,
		 uint32 *ci_sseq,
		 uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {
	if (sseq && ci_sseq) {
	    s = sseq[t];
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */
    		mean[s][f][0][c] += feat[t][f][c];

		if (s != ci_s) {
		    mean[ci_s][f][0][c] += feat[t][f][c];
		}
	    }
	}
    }
    return 0;
}